

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenUniformFunctionsCalledWithoutActivePO
          (GPUShaderFP64Test1 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  char *local_230;
  MessageBuilder local_228;
  int local_a8;
  GLenum error_code;
  undefined4 uStack_98;
  undefined4 uStack_94;
  double data [15];
  int function;
  bool result;
  Functions *gl;
  GPUShaderFP64Test1 *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  data[0xe]._7_1_ = 1;
  for (data[0xe]._0_4_ = UNIFORM_FUNCTION_1D; (int)data[0xe]._0_4_ < 0x11;
      data[0xe]._0_4_ = data[0xe]._0_4_ + UNIFORM_FUNCTION_1DV) {
    data[0xb] = 13.0;
    data[0xc] = 14.0;
    data[9] = 11.0;
    data[10] = 12.0;
    data[7] = 9.0;
    data[8] = 10.0;
    data[5] = 7.0;
    data[6] = 8.0;
    data[3] = 5.0;
    data[4] = 6.0;
    data[1] = 3.0;
    data[2] = 4.0;
    uStack_98 = 0;
    uStack_94 = 0x3ff00000;
    data[0]._0_4_ = 0;
    data[0]._4_4_ = 0x40000000;
    data[0xd] = 15.0;
    switch(data[0xe]._0_4_) {
    case UNIFORM_FUNCTION_1D:
      (**(code **)(lVar3 + 0x14d0))(0,this->m_po_double_uniform_location);
      break;
    case UNIFORM_FUNCTION_1DV:
      (**(code **)(lVar3 + 0x14d8))(this->m_po_double_uniform_location,1,&uStack_98);
      break;
    case UNIFORM_FUNCTION_2D:
      (**(code **)(lVar3 + 0x1510))(0,0x3ff0000000000000,this->m_po_dvec2_uniform_location);
      break;
    case UNIFORM_FUNCTION_2DV:
      (**(code **)(lVar3 + 0x1518))(this->m_po_dvec2_uniform_location,1,&uStack_98);
      break;
    case UNIFORM_FUNCTION_3D:
      (**(code **)(lVar3 + 0x1550))
                (0,0x3ff0000000000000,0x4000000000000000,this->m_po_dvec3_uniform_location);
      break;
    case UNIFORM_FUNCTION_3DV:
      (**(code **)(lVar3 + 0x1558))(this->m_po_dvec3_uniform_location,1,&uStack_98);
      break;
    case UNIFORM_FUNCTION_4D:
      (**(code **)(lVar3 + 0x1590))
                (0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000,
                 this->m_po_dvec4_uniform_location);
      break;
    case UNIFORM_FUNCTION_4DV:
      (**(code **)(lVar3 + 0x1598))(this->m_po_dvec4_uniform_location,1,&uStack_98);
      break;
    case UNIFORM_FUNCTION_MATRIX2DV:
      (**(code **)(lVar3 + 0x15d8))(this->m_po_dmat2_uniform_location,1,0,&uStack_98);
      break;
    case UNIFORM_FUNCTION_MATRIX2X3DV:
      (**(code **)(lVar3 + 0x15e8))(this->m_po_dmat2x3_uniform_location,1,0,&uStack_98);
      break;
    case UNIFORM_FUNCTION_MATRIX2X4DV:
      (**(code **)(lVar3 + 0x15f8))(this->m_po_dmat2x4_uniform_location,1,0,&uStack_98);
      break;
    case UNIFORM_FUNCTION_MATRIX3DV:
      (**(code **)(lVar3 + 0x1608))(this->m_po_dmat3_uniform_location,1,0,&uStack_98);
      break;
    case UNIFORM_FUNCTION_MATRIX3X2DV:
      (**(code **)(lVar3 + 0x1618))(this->m_po_dmat3x2_uniform_location,1,0,&uStack_98);
      break;
    case UNIFORM_FUNCTION_MATRIX3X4DV:
      (**(code **)(lVar3 + 0x1628))(this->m_po_dmat3x4_uniform_location,1,0,&uStack_98);
      break;
    case UNIFORM_FUNCTION_MATRIX4DV:
      (**(code **)(lVar3 + 0x1638))(this->m_po_dmat4_uniform_location,1,0,&uStack_98);
      break;
    case UNIFORM_FUNCTION_MATRIX4X2DV:
      (**(code **)(lVar3 + 0x1648))(this->m_po_dmat4x2_uniform_location,1,0,&uStack_98);
      break;
    case UNIFORM_FUNCTION_MATRIX4X3DV:
      (**(code **)(lVar3 + 0x1658))(this->m_po_dmat4x3_uniform_location,1,0,&uStack_98);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized uniform function",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xc95);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_a8 = (**(code **)(lVar3 + 0x800))();
    if (local_a8 != 0x502) {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_228,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_228,
                          (char (*) [57])"Implementation did not return GL_INVALID_OPERATION when ")
      ;
      local_230 = getUniformFunctionString(this,data[0xe]._0_4_);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_230);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [47])"() was called without an active program object");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_228);
      data[0xe]._7_1_ = 0;
    }
  }
  return (bool)(data[0xe]._7_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenUniformFunctionsCalledWithoutActivePO()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	for (int function = static_cast<int>(UNIFORM_FUNCTION_FIRST); function < static_cast<int>(UNIFORM_FUNCTION_COUNT);
		 function++)
	{
		const double data[] = { 1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0, 8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0 };

		switch (static_cast<_uniform_function>(function))
		{
		case UNIFORM_FUNCTION_1D:
			gl.uniform1d(m_po_double_uniform_location, 0.0);
			break;
		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(m_po_double_uniform_location, 1, data);
			break;
		case UNIFORM_FUNCTION_2D:
			gl.uniform2d(m_po_dvec2_uniform_location, 0.0, 1.0);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(m_po_dvec2_uniform_location, 1, data);
			break;
		case UNIFORM_FUNCTION_3D:
			gl.uniform3d(m_po_dvec3_uniform_location, 0.0, 1.0, 2.0);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(m_po_dvec3_uniform_location, 1, data);
			break;
		case UNIFORM_FUNCTION_4D:
			gl.uniform4d(m_po_dvec4_uniform_location, 0.0, 1.0, 2.0, 3.0);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(m_po_dvec4_uniform_location, 1, data);
			break;

		case UNIFORM_FUNCTION_MATRIX2DV:
			gl.uniformMatrix2dv(m_po_dmat2_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X3DV:
			gl.uniformMatrix2x3dv(m_po_dmat2x3_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X4DV:
			gl.uniformMatrix2x4dv(m_po_dmat2x4_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX3DV:
			gl.uniformMatrix3dv(m_po_dmat3_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X2DV:
			gl.uniformMatrix3x2dv(m_po_dmat3x2_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X4DV:
			gl.uniformMatrix3x4dv(m_po_dmat3x4_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX4DV:
			gl.uniformMatrix4dv(m_po_dmat4_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X2DV:
			gl.uniformMatrix4x2dv(m_po_dmat4x2_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X3DV:
			gl.uniformMatrix4x3dv(m_po_dmat4x3_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;

		default:
		{
			TCU_FAIL("Unrecognized uniform function");
		}
		} /* switch (func) */

		/* Query the error code */
		glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Implementation did not return GL_INVALID_OPERATION when "
							   << getUniformFunctionString(static_cast<_uniform_function>(function))
							   << "() was called without an active program object" << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all uniform functions) */

	return result;
}